

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O2

lws_spa * lws_spa_create(lws *wsi,char **param_names,int count_params,int max_storage,
                        lws_spa_fileupload_cb opt_cb,void *opt_data)

{
  lws_spa *plVar1;
  lws_spa_create_info_t local_38;
  
  local_38.param_names_stride = 0;
  local_38.ac = (lwsac **)0x0;
  local_38.ac_chunk_size = 0;
  local_38.param_names = param_names;
  local_38.count_params = count_params;
  local_38.max_storage = max_storage;
  local_38.opt_cb = opt_cb;
  local_38.opt_data = opt_data;
  plVar1 = lws_spa_create_via_info(wsi,&local_38);
  return plVar1;
}

Assistant:

struct lws_spa *
lws_spa_create(struct lws *wsi, const char * const *param_names,
	       int count_params, int max_storage,
	       lws_spa_fileupload_cb opt_cb, void *opt_data)
{
	lws_spa_create_info_t i;

	memset(&i, 0, sizeof(i));
	i.count_params = count_params;
	i.max_storage = max_storage;
	i.opt_cb = opt_cb;
	i.opt_data = opt_data;
	i.param_names = param_names;

	return lws_spa_create_via_info(wsi, &i);
}